

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O1

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab,int n_ctx,int n_gpu_layers)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  mapped_type pgVar3;
  void *pvVar4;
  FILE *__stream;
  _Alloc_hider _Var5;
  pointer pcVar6;
  gpt2_model *pgVar7;
  int32_t *piVar8;
  mapped_type mVar9;
  uint32_t uVar10;
  uint uVar11;
  char cVar12;
  int iVar13;
  uint uVar14;
  value_type *__val;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ggml_context *pgVar21;
  ggml_backend_buffer_t pgVar22;
  ggml_tensor *pgVar23;
  mapped_type *ppgVar24;
  long *plVar25;
  undefined8 *puVar26;
  iterator iVar27;
  ulong uVar28;
  undefined8 uVar29;
  ggml_backend_t pgVar30;
  undefined4 in_register_0000000c;
  int *piVar31;
  size_type *psVar32;
  undefined8 *puVar33;
  ulong *puVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  uint uVar38;
  int *piVar39;
  undefined4 in_register_00000084;
  string *psVar40;
  pointer pgVar41;
  undefined4 uVar42;
  long lVar43;
  bool bVar44;
  int iVar45;
  size_type sVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint32_t magic;
  vector<char,_std::allocator<char>_> buf;
  int32_t n_vocab;
  gpt2_hparams *hparams;
  uint32_t len;
  int32_t ne [2];
  int32_t length;
  int32_t ttype;
  ifstream fin;
  undefined8 uVar50;
  key_type local_348;
  key_type local_328;
  vector<char,_std::allocator<char>_> local_308;
  gpt_vocab *local_2e8;
  gpt2_model *local_2e0;
  uint local_2d4;
  int32_t *local_2d0;
  string *local_2c8;
  long local_2c0;
  _Base_ptr local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a4 [4];
  int32_t *local_2a0;
  uint32_t local_298;
  undefined4 local_294;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2e8 = vocab;
  local_2e0 = model;
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",(fname->_M_dataplus)._M_p,
         CONCAT44(in_register_0000000c,n_ctx),CONCAT44(in_register_00000084,n_gpu_layers));
  local_2c8 = fname;
  std::ifstream::ifstream(local_238,(string *)fname,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_238,(long)&local_348);
    pgVar7 = local_2e0;
    if ((int)local_348._M_dataplus._M_p != 0x67676d6c) {
      bVar44 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad magic)\n","gpt2_model_load",
              (local_2c8->_M_dataplus)._M_p);
      goto LAB_00109b37;
    }
    local_298 = n_ctx;
    std::istream::read((char *)local_238,(long)local_2e0);
    std::istream::read((char *)local_238,(long)&(pgVar7->hparams).n_ctx);
    std::istream::read((char *)local_238,(long)&(pgVar7->hparams).n_embd);
    std::istream::read((char *)local_238,(long)&(pgVar7->hparams).n_head);
    local_2a0 = &(pgVar7->hparams).n_layer;
    std::istream::read((char *)local_238,(long)local_2a0);
    local_2d0 = &(pgVar7->hparams).ftype;
    std::istream::read((char *)local_238,(long)local_2d0);
    iVar13 = (pgVar7->hparams).ftype;
    printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_vocab);
    printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_ctx);
    printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_embd);
    printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_head);
    printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_layer);
    printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).ftype);
    printf("%s: qntvr   = %d\n","gpt2_model_load",(ulong)(uint)(iVar13 / 1000));
    (pgVar7->hparams).ftype = (pgVar7->hparams).ftype % 1000;
    local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_ << 0x20);
    std::istream::read((char *)local_238,(long)&local_308);
    uVar38 = (uint)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar35 = (pgVar7->hparams).n_vocab;
    if ((uint)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == uVar35) {
      local_2c0 = CONCAT44(local_2c0._4_4_,uVar35);
      local_2b8 = (_Base_ptr)
                  CONCAT44(local_2b8._4_4_,
                           (uint)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity =
           local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_328.field_2._M_allocated_capacity = 0;
      local_328._M_dataplus._M_p = (pointer)0x0;
      local_328._M_string_length = 0;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_328._M_dataplus._M_p = (pointer)operator_new(0x80);
      local_328._M_string_length = (long)local_328._M_dataplus._M_p + 0x80;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x70) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x78) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x60) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x68) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x50) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x58) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x40) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x48) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x30) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x38) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x20) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x28) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x10) = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 0x18) = 0;
      *(size_type *)local_328._M_dataplus._M_p = 0;
      *(size_type *)((long)local_328._M_dataplus._M_p + 8) = 0;
      local_2b0 = local_2b0 & 0xffffffff00000000;
      local_328.field_2._M_allocated_capacity = local_328._M_string_length;
      if (0 < (int)(uint)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start) {
        this = &local_2e8->id_to_token;
        do {
          std::istream::read((char *)local_238,(long)&local_2d4);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)&local_328,(ulong)local_2d4);
          std::istream::read((char *)local_238,(long)local_328._M_dataplus._M_p);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_348,0,(char *)local_348._M_string_length,
                     (ulong)local_328._M_dataplus._M_p);
          mVar9 = (mapped_type)local_2b0;
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&local_2e8->token_to_id,&local_348);
          *pmVar15 = mVar9;
          pmVar16 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this,(key_type *)&local_2b0);
          std::__cxx11::string::_M_assign((string *)pmVar16);
          iVar13 = (mapped_type)local_2b0 + 1;
          local_2b0 = CONCAT44(local_2b0._4_4_,iVar13);
        } while (iVar13 < (int)(uint)local_308.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_328._M_dataplus._M_p,
                        local_328.field_2._M_allocated_capacity - (long)local_328._M_dataplus._M_p);
      }
      uVar38 = (uint)local_2b8;
      uVar35 = (uint)local_2c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n","gpt2_model_load",
              (local_2c8->_M_dataplus)._M_p,
              (ulong)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start & 0xffffffff,(ulong)uVar35);
    }
    if (uVar38 == uVar35) {
      iVar13 = ggml_ftype_to_ggml_type(*local_2d0);
      if (iVar13 == 0x27) {
        bVar44 = false;
        fprintf(_stderr,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                (local_2c8->_M_dataplus)._M_p,(ulong)(uint)*local_2d0);
        goto LAB_00109b37;
      }
      local_2d0 = (int32_t *)CONCAT44(local_2d0._4_4_,iVar13);
      iVar13 = (local_2e0->hparams).n_embd;
      lVar43 = (long)iVar13;
      local_2e8 = (gpt_vocab *)(long)(local_2e0->hparams).n_layer;
      iVar45 = (local_2e0->hparams).n_ctx;
      iVar2 = (local_2e0->hparams).n_vocab;
      local_2b8 = (_Base_ptr)ggml_row_size(0,lVar43);
      local_2c0 = ggml_row_size(0,lVar43);
      lVar36 = iVar2 * lVar43;
      lVar17 = ggml_row_size((ulong)local_2d0 & 0xffffffff,lVar36);
      local_2c8 = (string *)ggml_row_size(0,iVar45 * lVar43);
      local_258 = ggml_row_size((ulong)local_2d0 & 0xffffffff,lVar36);
      local_260 = ggml_row_size(0,lVar43);
      local_268 = ggml_row_size(0,lVar43);
      lVar36 = ggml_row_size(0,lVar43);
      local_270 = ggml_row_size(0,lVar43);
      local_278 = ggml_row_size((ulong)local_2d0 & 0xffffffff,(long)((int)(lVar43 * 3) * iVar13));
      local_280 = ggml_row_size(0,lVar43 * 3);
      local_288 = ggml_row_size((ulong)local_2d0 & 0xffffffff,iVar13 * iVar13);
      local_290 = ggml_row_size(0,lVar43);
      iVar45 = iVar13 * 4;
      lVar43 = ggml_row_size((ulong)local_2d0 & 0xffffffff,(long)(iVar45 * iVar13));
      lVar18 = ggml_row_size(0,(long)iVar45);
      lVar19 = ggml_row_size((ulong)local_2d0 & 0xffffffff,(long)(iVar45 * iVar13));
      lVar20 = ggml_row_size(0,(long)iVar45);
      lVar36 = (long)&local_2b8->_M_color +
               (long)&(local_2c8->_M_dataplus)._M_p +
               (lVar19 + lVar20 +
               lVar43 + lVar18 +
               lVar36 + local_270 + local_268 + local_260 + local_280 + local_288 + local_290 +
               local_278) * (long)local_2e8 +
               local_258 + ((int)local_2e8 * 0x600 + 0x300) + local_2c0 + lVar17;
      printf("%s: ggml tensor size    = %d bytes\n","gpt2_model_load",0x150);
      auVar47._8_4_ = (int)((ulong)lVar36 >> 0x20);
      auVar47._0_8_ = lVar36;
      auVar47._12_4_ = 0x45300000;
      printf("%s: backend buffer size = %6.2f MB\n",
             ((auVar47._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar36) - 4503599627370496.0)) * 9.5367431640625e-07,
             "gpt2_model_load");
      ggml_log_set(ggml_log_callback_default,0);
      piVar8 = local_2d0;
      uVar42 = local_2d0._0_4_;
      iVar13 = *local_2a0;
      lVar17 = ggml_tensor_overhead();
      lVar17 = lVar17 * ((long)iVar13 * 0xc + 8);
      uStack_248 = 0;
      local_240 = 1;
      uVar50 = 0;
      local_250 = lVar17;
      pgVar21 = (ggml_context *)ggml_init();
      local_2e0->ctx_w = pgVar21;
      if (pgVar21 == (ggml_context *)0x0) {
        gpt2_model_load();
      }
      else {
        if (local_2e0->backend == (ggml_backend_t)0x0) {
          fprintf(_stderr,"%s: using CPU backend\n","gpt2_model_load");
          pgVar30 = (ggml_backend_t)ggml_backend_cpu_init();
          local_2e0->backend = pgVar30;
        }
        if (local_2e0->backend == (ggml_backend_t)0x0) {
          gpt2_model_load();
        }
        else {
          pgVar22 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(local_2e0->backend,lVar36);
          pgVar7 = local_2e0;
          local_2e0->buffer_w = pgVar22;
          psVar40 = (string *)(long)(local_2e0->hparams).n_embd;
          local_2a0 = (int32_t *)(long)(local_2e0->hparams).n_layer;
          iVar13 = (local_2e0->hparams).n_ctx;
          lVar36 = (long)(local_2e0->hparams).n_vocab;
          std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                    (&local_2e0->layers,(size_type)local_2a0);
          pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,psVar40);
          pgVar7->ln_f_g = pgVar23;
          pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,psVar40);
          pgVar7->ln_f_b = pgVar23;
          pgVar23 = (ggml_tensor *)
                    ggml_new_tensor_2d(pgVar7->ctx_w,(ulong)piVar8 & 0xffffffff,psVar40,lVar36);
          pgVar7->wte = pgVar23;
          pgVar23 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,0,psVar40,(long)iVar13);
          pgVar7->wpe = pgVar23;
          pgVar23 = (ggml_tensor *)
                    ggml_new_tensor_2d(pgVar7->ctx_w,(ulong)piVar8 & 0xffffffff,psVar40,lVar36);
          pgVar7->lm_head = pgVar23;
          pgVar3 = pgVar7->ln_f_g;
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/ln_f/g","");
          local_2e8 = (gpt_vocab *)&pgVar7->tensors;
          ppgVar24 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e8,&local_348);
          *ppgVar24 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          pgVar3 = local_2e0->ln_f_b;
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/ln_f/b","");
          ppgVar24 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e8,&local_348);
          *ppgVar24 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          pgVar3 = local_2e0->wte;
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/wte","");
          ppgVar24 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e8,&local_348);
          *ppgVar24 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          pgVar3 = local_2e0->wpe;
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/wpe","");
          ppgVar24 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e8,&local_348);
          *ppgVar24 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          pgVar3 = local_2e0->lm_head;
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/lm_head","");
          ppgVar24 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e8,&local_348);
          *ppgVar24 = pgVar3;
          local_2c8 = psVar40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if (0 < (int)local_2a0) {
            local_2c0 = (long)local_2c8 * 3;
            local_2b8 = (_Base_ptr)(long)((int)local_2c8 * 4);
            piVar39 = (int *)0x0;
            do {
              psVar40 = local_2c8;
              pgVar7 = local_2e0;
              pgVar41 = (local_2e0->layers).
                        super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)piVar39;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(local_2e0->ctx_w,0,local_2c8);
              pgVar41->ln_1_g = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,psVar40);
              pgVar41->ln_1_b = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,psVar40);
              pgVar41->ln_2_g = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,psVar40);
              pgVar41->ln_2_b = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar42,psVar40,local_2c0);
              pgVar41->c_attn_attn_w = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,local_2c0);
              pgVar41->c_attn_attn_b = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar42,psVar40,psVar40);
              pgVar41->c_attn_proj_w = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,psVar40);
              pgVar41->c_attn_proj_b = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar42,psVar40,local_2b8);
              pgVar41->c_mlp_fc_w = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,local_2b8);
              pgVar41->c_mlp_fc_b = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar42,local_2b8,psVar40);
              pgVar41->c_mlp_proj_w = pgVar23;
              pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,psVar40);
              pgVar41->c_mlp_proj_b = pgVar23;
              uVar35 = 1;
              paVar1 = &local_328.field_2;
              uVar38 = (uint)piVar39;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_0010822d;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_0010822d;
                  }
                  if (uVar14 < 10000) goto LAB_0010822d;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_0010822d:
              pgVar3 = pgVar41->ln_1_g;
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->ln_1_b;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_001083c8;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_001083c8;
                  }
                  if (uVar14 < 10000) goto LAB_001083c8;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_001083c8:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->ln_2_g;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_0010855f;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_0010855f;
                  }
                  if (uVar14 < 10000) goto LAB_0010855f;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_0010855f:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->ln_2_b;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_001086f6;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_001086f6;
                  }
                  if (uVar14 < 10000) goto LAB_001086f6;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_001086f6:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_attn_attn_w;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_0010888d;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_0010888d;
                  }
                  if (uVar14 < 10000) goto LAB_0010888d;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_0010888d:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_attn_attn_b;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_00108a24;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_00108a24;
                  }
                  if (uVar14 < 10000) goto LAB_00108a24;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_00108a24:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_attn_proj_w;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_00108bbb;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_00108bbb;
                  }
                  if (uVar14 < 10000) goto LAB_00108bbb;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_00108bbb:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_attn_proj_b;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_00108d52;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_00108d52;
                  }
                  if (uVar14 < 10000) goto LAB_00108d52;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_00108d52:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_mlp_fc_w;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_00108ee9;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_00108ee9;
                  }
                  if (uVar14 < 10000) goto LAB_00108ee9;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_00108ee9:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_mlp_fc_b;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_00109080;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_00109080;
                  }
                  if (uVar14 < 10000) goto LAB_00109080;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_00109080:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_mlp_proj_w;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_00109217;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_00109217;
                  }
                  if (uVar14 < 10000) goto LAB_00109217;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_00109217:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              plVar25 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x1212f9);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328.field_2._8_8_ = plVar25[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *psVar32;
                local_328._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_328._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *psVar32;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              uVar42 = local_2d0._0_4_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              pgVar3 = pgVar41->c_mlp_proj_b;
              uVar35 = 1;
              if ((int *)0x9 < piVar39) {
                uVar11 = 4;
                piVar31 = piVar39;
                do {
                  uVar35 = uVar11;
                  uVar14 = (uint)piVar31;
                  if (uVar14 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_001093b6;
                  }
                  if (uVar14 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_001093b6;
                  }
                  if (uVar14 < 10000) goto LAB_001093b6;
                  piVar31 = (int *)(((ulong)piVar31 & 0xffffffff) / 10000);
                  uVar11 = uVar35 + 4;
                } while (99999 < uVar14);
                uVar35 = uVar35 + 1;
              }
LAB_001093b6:
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar35);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar35,uVar38);
              puVar26 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x1212f9);
              puVar33 = puVar26 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar26 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar33) {
                local_328.field_2._M_allocated_capacity = *puVar33;
                local_328.field_2._8_8_ = puVar26[3];
                local_328._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_328.field_2._M_allocated_capacity = *puVar33;
                local_328._M_dataplus._M_p = (pointer)*puVar26;
              }
              local_328._M_string_length = puVar26[1];
              *puVar26 = puVar33;
              puVar26[1] = 0;
              *(undefined1 *)(puVar26 + 2) = 0;
              plVar25 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              puVar34 = (ulong *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar34) {
                local_348.field_2._M_allocated_capacity = *puVar34;
                local_348.field_2._8_8_ = plVar25[3];
              }
              else {
                local_348.field_2._M_allocated_capacity = *puVar34;
                local_348._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_348._M_string_length = plVar25[1];
              *plVar25 = (long)puVar34;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              *ppgVar24 = pgVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar1) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((pointer *)
                  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(local_308.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              piVar39 = (int *)((long)piVar39 + 1);
            } while (piVar39 != local_2a0);
          }
          uVar10 = local_298;
          pgVar7 = local_2e0;
          (local_2e0->hparams).n_ctx = local_298;
          sVar46 = (size_type)(int)local_298;
          uVar37 = (long)(local_2e0->hparams).n_layer * sVar46;
          lVar36 = (long)(local_2e0->hparams).n_embd * uVar37;
          pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(local_2e0->ctx_w,0,lVar36);
          (pgVar7->kv_cache).k = pgVar23;
          pgVar23 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar36);
          (pgVar7->kv_cache).v = pgVar23;
          (pgVar7->kv_cache).head = 0;
          (pgVar7->kv_cache).size = uVar10;
          std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::resize
                    (&(pgVar7->kv_cache).cells,sVar46);
          lVar36 = ggml_nbytes((pgVar7->kv_cache).k);
          lVar43 = ggml_nbytes((pgVar7->kv_cache).v);
          lVar18 = lVar43 + lVar36;
          auVar48._8_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar48._0_8_ = lVar18;
          auVar48._12_4_ = 0x45300000;
          printf("%s: memory size = %8.2f MB, n_mem = %d\n",
                 ((auVar48._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625,"gpt2_model_load",uVar37 & 0xffffffff);
          pgVar22 = (ggml_backend_buffer_t)
                    ggml_backend_alloc_buffer(pgVar7->backend,lVar43 + lVar36 + 0x100);
          (pgVar7->kv_cache).buffer = pgVar22;
          ggml_tallocr_new(&local_348,pgVar22);
          ggml_tallocr_alloc(&local_348,(pgVar7->kv_cache).k);
          ggml_tallocr_alloc(&local_348,(pgVar7->kv_cache).v);
          ggml_tallocr_new(&local_348,pgVar7->buffer_w);
          local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_2b8 = &(pgVar7->tensors)._M_t._M_impl.super__Rb_tree_header._M_header;
          local_2c0 = 0;
          bVar44 = false;
          do {
            std::istream::read((char *)local_238,(long)&local_2d4);
            std::istream::read((char *)local_238,(long)local_2a4);
            std::istream::read((char *)local_238,(long)&local_294);
            iVar13 = 9;
            if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
              local_2b0 = 0x100000001;
              if ((int)local_2d4 < 1) {
                lVar36 = 1;
              }
              else {
                lVar36 = 1;
                piVar39 = (int *)&local_2b0;
                lVar43 = 0;
                do {
                  std::istream::read((char *)local_238,(long)piVar39);
                  lVar36 = (long)(int)lVar36 * (long)*piVar39;
                  lVar43 = lVar43 + 1;
                  piVar39 = piVar39 + 1;
                } while (lVar43 < (int)local_2d4);
              }
              local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_328,local_2a4[0]);
              std::istream::read((char *)local_238,(long)local_328._M_dataplus._M_p);
              iVar27 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_2e8,&local_328);
              if (iVar27._M_node == local_2b8) {
                gpt2_model_load();
LAB_00109990:
                iVar13 = 1;
              }
              else {
                ppgVar24 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)local_2e8,&local_328);
                pgVar3 = *ppgVar24;
                ggml_set_name(pgVar3,local_328._M_dataplus._M_p);
                lVar43 = ggml_nelements(pgVar3);
                if (lVar43 != lVar36) {
                  gpt2_model_load();
                  goto LAB_00109990;
                }
                if ((pgVar3->ne[0] != (long)(mapped_type)local_2b0) ||
                   (pgVar3->ne[1] != (long)local_2b0._4_4_)) {
                  uVar50 = CONCAT44((int)((ulong)uVar50 >> 0x20),local_2b0._4_4_);
                  lVar17 = CONCAT44((int)((ulong)lVar17 >> 0x20),(mapped_type)local_2b0);
                  fprintf(_stderr,
                          "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                          ,"gpt2_model_load",local_328._M_dataplus._M_p,pgVar3->ne[0],
                          (ulong)(uint)pgVar3->ne[1],lVar17,uVar50);
                  goto LAB_00109990;
                }
                lVar43 = ggml_type_size(local_294);
                uVar37 = ggml_blck_size(pgVar3->type);
                uVar28 = ggml_nbytes(pgVar3);
                _Var5._M_p = local_328._M_dataplus._M_p;
                __stream = _stderr;
                if ((ulong)(lVar43 * lVar36) / uVar37 != uVar28) {
                  uVar29 = ggml_nbytes(pgVar3);
                  fprintf(__stream,
                          "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                          "gpt2_model_load",_Var5._M_p,uVar29,lVar43 * lVar36);
                  goto LAB_00109990;
                }
                ggml_tallocr_alloc(&local_348,pgVar3);
                cVar12 = ggml_backend_is_cpu(local_2e0->backend);
                if (cVar12 == '\0') {
                  sVar46 = ggml_nbytes(pgVar3);
                  std::vector<char,_std::allocator<char>_>::resize(&local_308,sVar46);
                  pcVar6 = local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  ggml_nbytes(pgVar3);
                  std::istream::read((char *)local_238,(long)pcVar6);
                  pcVar6 = local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar29 = ggml_nbytes(pgVar3);
                  ggml_backend_tensor_set(pgVar3,pcVar6,0,uVar29);
                }
                else {
                  pvVar4 = pgVar3->data;
                  ggml_nbytes(pgVar3);
                  std::istream::read((char *)local_238,(long)pvVar4);
                }
                iVar13 = std::__cxx11::string::compare((char *)&local_328);
                if ((iVar13 == 0) && (!bVar44)) {
                  local_2e0->lm_head = pgVar3;
                }
                iVar13 = std::__cxx11::string::compare((char *)&local_328);
                lVar36 = ggml_nbytes(pgVar3);
                if (iVar13 == 0) {
                  bVar44 = true;
                }
                local_2c0 = local_2c0 + lVar36;
                iVar13 = 0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
            }
          } while (iVar13 == 0);
          if (iVar13 == 9) {
            auVar49._0_8_ = (double)CONCAT44(0x43300000,(int)local_2c0);
            auVar49._8_4_ = (int)((ulong)local_2c0 >> 0x20);
            auVar49._12_4_ = 0x45300000;
            printf("%s: model size  = %8.2f MB\n",
                   ((auVar49._8_8_ - 1.9342813113834067e+25) + (auVar49._0_8_ - 4503599627370496.0))
                   * 0.0009765625 * 0.0009765625,"gpt2_model_load");
          }
          if ((pointer *)
              local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (iVar13 == 9) {
            bVar44 = true;
            std::ifstream::close();
            goto LAB_00109b37;
          }
        }
      }
    }
  }
  else {
    gpt2_model_load();
  }
  bVar44 = false;
LAB_00109b37:
  std::ifstream::~ifstream(local_238);
  return bVar44;
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab, int n_ctx, int n_gpu_layers) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    size_t buffer_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        buffer_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_g
        buffer_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_b

        buffer_size += ggml_row_size(wtype,         n_vocab*n_embd); // wte
        buffer_size += ggml_row_size(GGML_TYPE_F32,   n_ctx*n_embd); // wpe
        buffer_size += ggml_row_size(wtype,         n_vocab*n_embd); // lm_head

        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_g
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_b

        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_g
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_b

        buffer_size += n_layer*(ggml_row_size(wtype,         3*n_embd*n_embd)); // c_attn_attn_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 3*n_embd));        // c_attn_attn_b

        buffer_size += n_layer*(ggml_row_size(wtype,         n_embd*n_embd));   // c_attn_proj_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd));          // c_attn_proj_b

        buffer_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_fc_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_fc_b

        buffer_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_proj_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_proj_b

        buffer_size += (6 + 12*n_layer)*128; // alignment overhead

        printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
        printf("%s: backend buffer size = %6.2f MB\n", __func__, buffer_size/(1024.0*1024.0));
    }

    ggml_log_set(ggml_log_callback_default, nullptr);

    // create the ggml context
    {
        size_t n_tensors = 2 + 6 + 12*model.hparams.n_layer;
        struct ggml_init_params params = {
            /*.mem_size   =*/ ggml_tensor_overhead() * n_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (n_gpu_layers > 0) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (n_gpu_layers > 0) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if (!model.backend) {
        // fallback to CPU backend
        fprintf(stderr, "%s: using CPU backend\n", __func__);
        model.backend = ggml_backend_cpu_init();
    }

    if (!model.backend) {
        fprintf(stderr, "%s: ggml_backend_cpu_init() failed\n", __func__);
        return false;
    }

    // allocate weights buffer
    model.buffer_w = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // override the default training context with the user-provided
    model.hparams.n_ctx = n_ctx;

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.kv_cache.k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.kv_cache.v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        model.kv_cache.head      = 0;
        model.kv_cache.size      = n_ctx;

        model.kv_cache.cells.resize(n_ctx);

        const size_t memory_size = ggml_nbytes(model.kv_cache.k) + ggml_nbytes(model.kv_cache.v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);

        // create a backend buffer (can be in host or device memory)
        model.kv_cache.buffer = ggml_backend_alloc_buffer(model.backend, memory_size + 256);

        // allocate the tensors into the backend buffer
        {
            ggml_tallocr alloc = ggml_tallocr_new(model.kv_cache.buffer);

            // this updates the pointers in the tensors to point to the correct location in the buffer
            // this is necessary since the ggml_context is .no_alloc == true
            // note that the buffer can actually be a device buffer, depending on the backend
            ggml_tallocr_alloc(&alloc, model.kv_cache.k);
            ggml_tallocr_alloc(&alloc, model.kv_cache.v);
        }
    }

    // load weights
    {
        ggml_tallocr alloc = ggml_tallocr_new(model.buffer_w);

        size_t total_size = 0;

        bool has_lm_head = false;

        std::vector<char> read_buf;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            ggml_set_name(tensor, name.c_str());
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            ggml_tallocr_alloc(&alloc, tensor);

            if (ggml_backend_is_cpu  (model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
                ) {
                // for the CPU and Metal backend, we can read directly into the tensor
                fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
            } else {
                // read into a temporary buffer first, then copy to device memory
                read_buf.resize(ggml_nbytes(tensor));
                fin.read(read_buf.data(), ggml_nbytes(tensor));
                ggml_backend_tensor_set(tensor, read_buf.data(), 0, ggml_nbytes(tensor));
            }

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                //ggml_tallocr_alloc(alloc, model.lm_head);
                //ggml_backend_tensor_copy(tensor, model.lm_head);
                model.lm_head = tensor;
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }

        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    return true;
}